

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistatstest.cpp
# Opt level: O0

void test_dynamichistogram_disabled(void)

{
  DynamicHistogramOptions *this;
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  stringstream msg_16;
  stringstream msg_15;
  stringstream msg_14;
  stringstream msg_13;
  stringstream msg_12;
  stringstream msg_11;
  stringstream msg_10;
  stringstream msg_9;
  stringstream msg_8;
  stringstream msg_7;
  stringstream msg_6;
  stringstream msg_5;
  stringstream msg_4;
  stringstream msg_3;
  stringstream msg_2;
  string local_408 [32];
  stringstream local_3e8 [8];
  stringstream msg_1;
  ostream local_3d8 [383];
  undefined1 local_259;
  string local_258 [32];
  stringstream local_238 [8];
  stringstream msg;
  ostream local_228 [392];
  undefined1 local_a0 [8];
  DynamicHistogram<double> histogramDisabled;
  DynamicHistogramOptions options;
  
  this = (DynamicHistogramOptions *)
         ((long)&histogramDisabled._temp.super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 4);
  DynamicHistogramOptions::DynamicHistogramOptions(this,false,100,1000);
  DynamicHistogram<double>::DynamicHistogram((DynamicHistogram<double> *)local_a0,this);
  bVar1 = DynamicHistogram<double>::add((DynamicHistogram<double> *)local_a0,1.0);
  if (!bVar1) {
    DynamicHistogram<double>::bin((DynamicHistogram<double> *)local_a0,0);
    std::__cxx11::stringstream::stringstream(local_3e8);
    poVar2 = std::operator<<(local_3d8,"DynamicHistogram::bin failed on disabled histogram");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_408);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_238);
  poVar2 = std::operator<<(local_228,"DynamicHistogram::add failed on disabled histogram");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_259 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar3,local_258);
  local_259 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_dynamichistogram_disabled()
{

    DynamicHistogramOptions options(false);
    DynamicHistogram<double> histogramDisabled(options);
    ASSERT(!histogramDisabled.add(1), "DynamicHistogram::add failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.bin(0), "DynamicHistogram::bin failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.cdf(), "DynamicHistogram::cdf failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.contains(0), "DynamicHistogram::contains failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.count(), "DynamicHistogram::count failed on disabled histogram");
    ASSERT(!histogramDisabled.enabled(), "DynamicHistogram::enabled failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.frequency(0), "DynamicHistogram::frequency failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.frequencies(), "DynamicHistogram::frequencies failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.index(0), "DynamicHistogram::index failed on disabled histogram");
    ASSERT(!histogramDisabled.initialized(), "DynamicHistogram::initialized failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.max(), "DynamicHistogram::max failed on disabled histogram");
    ASSERT_EQUAL(histogramDisabled.merges(), 0, "DynamicHistogram::merges failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.min(), "DynamicHistogram::min failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.order(0), "DynamicHistogram::order failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.pdf(), "DynamicHistogram::pdf failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.total(), "DynamicHistogram::total failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.width(0), "DynamicHistogram::width failed on disabled histogram");

}